

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O0

void aes_encrypt(aes_context *ctx,uint8_t *input,uint8_t *output)

{
  uint uVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  uint32_t uVar18;
  uint32_t uVar19;
  uint32_t uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint x;
  uint x_00;
  uint32_t *puVar25;
  long local_50;
  size_t i;
  uint32_t s3;
  uint32_t s2;
  uint32_t s1;
  uint32_t s0;
  uint32_t *key;
  uint32_t t3;
  uint32_t t2;
  uint32_t t1;
  uint32_t t0;
  uint8_t *output_local;
  uint8_t *input_local;
  aes_context *ctx_local;
  
  uVar18 = get32be(input);
  s2 = uVar18 ^ ctx->key[0];
  uVar18 = get32be(input + 4);
  s3 = uVar18 ^ ctx->key[1];
  uVar18 = get32be(input + 8);
  i._4_4_ = uVar18 ^ ctx->key[2];
  uVar18 = get32be(input + 0xc);
  _s1 = ctx->key + 4;
  i._0_4_ = uVar18 ^ ctx->key[3];
  for (local_50 = (long)((ctx->nr >> 1) + -1); local_50 != 0; local_50 = local_50 + -1) {
    bVar2 = byte32(s2,3);
    uVar1 = TE[bVar2];
    bVar2 = byte32(s3,2);
    uVar18 = ror32(TE[bVar2],8);
    bVar2 = byte32(i._4_4_,1);
    uVar19 = ror32(TE[bVar2],0x10);
    bVar2 = byte32((uint)i,0);
    uVar20 = ror32(TE[bVar2],0x18);
    uVar21 = uVar1 ^ uVar18 ^ uVar19 ^ uVar20 ^ *_s1;
    bVar2 = byte32(s3,3);
    uVar1 = TE[bVar2];
    bVar2 = byte32(i._4_4_,2);
    uVar18 = ror32(TE[bVar2],8);
    bVar2 = byte32((uint)i,1);
    uVar19 = ror32(TE[bVar2],0x10);
    bVar2 = byte32(s2,0);
    uVar20 = ror32(TE[bVar2],0x18);
    uVar22 = uVar1 ^ uVar18 ^ uVar19 ^ uVar20 ^ _s1[1];
    bVar2 = byte32(i._4_4_,3);
    uVar1 = TE[bVar2];
    bVar2 = byte32((uint)i,2);
    uVar18 = ror32(TE[bVar2],8);
    bVar2 = byte32(s2,1);
    uVar19 = ror32(TE[bVar2],0x10);
    bVar2 = byte32(s3,0);
    uVar20 = ror32(TE[bVar2],0x18);
    uVar23 = uVar1 ^ uVar18 ^ uVar19 ^ uVar20 ^ _s1[2];
    bVar2 = byte32((uint)i,3);
    uVar1 = TE[bVar2];
    bVar2 = byte32(s2,2);
    uVar18 = ror32(TE[bVar2],8);
    bVar2 = byte32(s3,1);
    uVar19 = ror32(TE[bVar2],0x10);
    bVar2 = byte32(i._4_4_,0);
    uVar20 = ror32(TE[bVar2],0x18);
    uVar24 = uVar1 ^ uVar18 ^ uVar19 ^ uVar20 ^ _s1[3];
    bVar2 = byte32(uVar21,3);
    uVar1 = TE[bVar2];
    bVar2 = byte32(uVar22,2);
    uVar18 = ror32(TE[bVar2],8);
    bVar2 = byte32(uVar23,1);
    uVar19 = ror32(TE[bVar2],0x10);
    bVar2 = byte32(uVar24,0);
    uVar20 = ror32(TE[bVar2],0x18);
    s2 = uVar1 ^ uVar18 ^ uVar19 ^ uVar20 ^ _s1[4];
    bVar2 = byte32(uVar22,3);
    uVar1 = TE[bVar2];
    bVar2 = byte32(uVar23,2);
    uVar18 = ror32(TE[bVar2],8);
    bVar2 = byte32(uVar24,1);
    uVar19 = ror32(TE[bVar2],0x10);
    bVar2 = byte32(uVar21,0);
    uVar20 = ror32(TE[bVar2],0x18);
    s3 = uVar1 ^ uVar18 ^ uVar19 ^ uVar20 ^ _s1[5];
    bVar2 = byte32(uVar23,3);
    uVar1 = TE[bVar2];
    bVar2 = byte32(uVar24,2);
    uVar18 = ror32(TE[bVar2],8);
    bVar2 = byte32(uVar21,1);
    uVar19 = ror32(TE[bVar2],0x10);
    bVar2 = byte32(uVar22,0);
    uVar20 = ror32(TE[bVar2],0x18);
    puVar25 = _s1 + 7;
    i._4_4_ = uVar1 ^ uVar18 ^ uVar19 ^ uVar20 ^ _s1[6];
    bVar2 = byte32(uVar24,3);
    uVar1 = TE[bVar2];
    bVar2 = byte32(uVar21,2);
    uVar18 = ror32(TE[bVar2],8);
    bVar2 = byte32(uVar22,1);
    uVar19 = ror32(TE[bVar2],0x10);
    bVar2 = byte32(uVar23,0);
    uVar20 = ror32(TE[bVar2],0x18);
    _s1 = _s1 + 8;
    i._0_4_ = uVar1 ^ uVar18 ^ uVar19 ^ uVar20 ^ *puVar25;
  }
  bVar2 = byte32(s2,3);
  uVar1 = TE[bVar2];
  bVar2 = byte32(s3,2);
  uVar18 = ror32(TE[bVar2],8);
  bVar2 = byte32(i._4_4_,1);
  uVar19 = ror32(TE[bVar2],0x10);
  bVar2 = byte32((uint)i,0);
  uVar20 = ror32(TE[bVar2],0x18);
  uVar23 = uVar1 ^ uVar18 ^ uVar19 ^ uVar20 ^ *_s1;
  bVar2 = byte32(s3,3);
  uVar1 = TE[bVar2];
  bVar2 = byte32(i._4_4_,2);
  uVar18 = ror32(TE[bVar2],8);
  bVar2 = byte32((uint)i,1);
  uVar19 = ror32(TE[bVar2],0x10);
  bVar2 = byte32(s2,0);
  uVar20 = ror32(TE[bVar2],0x18);
  uVar24 = uVar1 ^ uVar18 ^ uVar19 ^ uVar20 ^ _s1[1];
  bVar2 = byte32(i._4_4_,3);
  uVar1 = TE[bVar2];
  bVar2 = byte32((uint)i,2);
  uVar18 = ror32(TE[bVar2],8);
  bVar2 = byte32(s2,1);
  uVar19 = ror32(TE[bVar2],0x10);
  bVar2 = byte32(s3,0);
  uVar20 = ror32(TE[bVar2],0x18);
  x = uVar1 ^ uVar18 ^ uVar19 ^ uVar20 ^ _s1[2];
  bVar2 = byte32((uint)i,3);
  uVar1 = TE[bVar2];
  bVar2 = byte32(s2,2);
  uVar18 = ror32(TE[bVar2],8);
  bVar2 = byte32(s3,1);
  uVar19 = ror32(TE[bVar2],0x10);
  bVar2 = byte32(i._4_4_,0);
  uVar20 = ror32(TE[bVar2],0x18);
  x_00 = uVar1 ^ uVar18 ^ uVar19 ^ uVar20 ^ _s1[3];
  bVar2 = byte32(uVar23,3);
  bVar2 = Te[bVar2];
  bVar3 = byte32(uVar24,2);
  bVar3 = Te[bVar3];
  bVar4 = byte32(x,1);
  bVar4 = Te[bVar4];
  bVar5 = byte32(x_00,0);
  bVar5 = Te[bVar5];
  uVar1 = _s1[4];
  bVar6 = byte32(uVar24,3);
  bVar6 = Te[bVar6];
  bVar7 = byte32(x,2);
  bVar7 = Te[bVar7];
  bVar8 = byte32(x_00,1);
  bVar8 = Te[bVar8];
  bVar9 = byte32(uVar23,0);
  bVar9 = Te[bVar9];
  uVar21 = _s1[5];
  bVar10 = byte32(x,3);
  bVar10 = Te[bVar10];
  bVar11 = byte32(x_00,2);
  bVar11 = Te[bVar11];
  bVar12 = byte32(uVar23,1);
  bVar12 = Te[bVar12];
  bVar13 = byte32(uVar24,0);
  bVar13 = Te[bVar13];
  uVar22 = _s1[6];
  bVar14 = byte32(x_00,3);
  bVar14 = Te[bVar14];
  bVar15 = byte32(uVar23,2);
  bVar15 = Te[bVar15];
  bVar16 = byte32(uVar24,1);
  bVar16 = Te[bVar16];
  bVar17 = byte32(x,0);
  bVar17 = Te[bVar17];
  uVar23 = _s1[7];
  set32be(output,(uint)bVar2 << 0x18 ^ (uint)bVar3 << 0x10 ^ (uint)bVar4 << 8 ^ (uint)bVar5 ^ uVar1)
  ;
  set32be(output + 4,
          (uint)bVar6 << 0x18 ^ (uint)bVar7 << 0x10 ^ (uint)bVar8 << 8 ^ (uint)bVar9 ^ uVar21);
  set32be(output + 8,
          (uint)bVar10 << 0x18 ^ (uint)bVar11 << 0x10 ^ (uint)bVar12 << 8 ^ (uint)bVar13 ^ uVar22);
  set32be(output + 0xc,
          (uint)bVar14 << 0x18 ^ (uint)bVar15 << 0x10 ^ (uint)bVar16 << 8 ^ (uint)bVar17 ^ uVar23);
  return;
}

Assistant:

static void aes_encrypt(const aes_context* ctx, const uint8_t* input, uint8_t* output)
{
    uint32_t t0, t1, t2, t3;
    const uint32_t* key = ctx->key;

    uint32_t s0 = get32be(input + 0) ^ *key++;
    uint32_t s1 = get32be(input + 4) ^ *key++;
    uint32_t s2 = get32be(input + 8) ^ *key++;
    uint32_t s3 = get32be(input + 12) ^ *key++;

    for (size_t i = (ctx->nr>>1)-1; i > 0; i--)
    {
        t0 = TE[byte32(s0, 3)] ^ ror32(TE[byte32(s1, 2)], 8) ^ ror32(TE[byte32(s2, 1)], 16) ^ ror32(TE[byte32(s3, 0)], 24) ^ *key++;
        t1 = TE[byte32(s1, 3)] ^ ror32(TE[byte32(s2, 2)], 8) ^ ror32(TE[byte32(s3, 1)], 16) ^ ror32(TE[byte32(s0, 0)], 24) ^ *key++;
        t2 = TE[byte32(s2, 3)] ^ ror32(TE[byte32(s3, 2)], 8) ^ ror32(TE[byte32(s0, 1)], 16) ^ ror32(TE[byte32(s1, 0)], 24) ^ *key++;
        t3 = TE[byte32(s3, 3)] ^ ror32(TE[byte32(s0, 2)], 8) ^ ror32(TE[byte32(s1, 1)], 16) ^ ror32(TE[byte32(s2, 0)], 24) ^ *key++;

        s0 = TE[byte32(t0, 3)] ^ ror32(TE[byte32(t1, 2)], 8) ^ ror32(TE[byte32(t2, 1)], 16) ^ ror32(TE[byte32(t3, 0)], 24) ^ *key++;
        s1 = TE[byte32(t1, 3)] ^ ror32(TE[byte32(t2, 2)], 8) ^ ror32(TE[byte32(t3, 1)], 16) ^ ror32(TE[byte32(t0, 0)], 24) ^ *key++;
        s2 = TE[byte32(t2, 3)] ^ ror32(TE[byte32(t3, 2)], 8) ^ ror32(TE[byte32(t0, 1)], 16) ^ ror32(TE[byte32(t1, 0)], 24) ^ *key++;
        s3 = TE[byte32(t3, 3)] ^ ror32(TE[byte32(t0, 2)], 8) ^ ror32(TE[byte32(t1, 1)], 16) ^ ror32(TE[byte32(t2, 0)], 24) ^ *key++;
    }

    t0 = TE[byte32(s0, 3)] ^ ror32(TE[byte32(s1, 2)], 8) ^ ror32(TE[byte32(s2, 1)], 16) ^ ror32(TE[byte32(s3, 0)], 24) ^ *key++;
    t1 = TE[byte32(s1, 3)] ^ ror32(TE[byte32(s2, 2)], 8) ^ ror32(TE[byte32(s3, 1)], 16) ^ ror32(TE[byte32(s0, 0)], 24) ^ *key++;
    t2 = TE[byte32(s2, 3)] ^ ror32(TE[byte32(s3, 2)], 8) ^ ror32(TE[byte32(s0, 1)], 16) ^ ror32(TE[byte32(s1, 0)], 24) ^ *key++;
    t3 = TE[byte32(s3, 3)] ^ ror32(TE[byte32(s0, 2)], 8) ^ ror32(TE[byte32(s1, 1)], 16) ^ ror32(TE[byte32(s2, 0)], 24) ^ *key++;

    s0 = (Te[byte32(t0, 3)] << 24) ^ (Te[byte32(t1, 2)] << 16) ^ (Te[byte32(t2, 1)] << 8) ^ Te[byte32(t3, 0)] ^ *key++;
    s1 = (Te[byte32(t1, 3)] << 24) ^ (Te[byte32(t2, 2)] << 16) ^ (Te[byte32(t3, 1)] << 8) ^ Te[byte32(t0, 0)] ^ *key++;
    s2 = (Te[byte32(t2, 3)] << 24) ^ (Te[byte32(t3, 2)] << 16) ^ (Te[byte32(t0, 1)] << 8) ^ Te[byte32(t1, 0)] ^ *key++;
    s3 = (Te[byte32(t3, 3)] << 24) ^ (Te[byte32(t0, 2)] << 16) ^ (Te[byte32(t1, 1)] << 8) ^ Te[byte32(t2, 0)] ^ *key++;

    set32be(output + 0, s0);
    set32be(output + 4, s1);
    set32be(output + 8, s2);
    set32be(output + 12, s3);
}